

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

ON_EarthAnchorPoint *
Internal_EarthAnchorPointConstant(ON_EarthAnchorPoint *__return_storage_ptr__,int which)

{
  ON_EarthAnchorPoint::ON_EarthAnchorPoint(__return_storage_ptr__);
  if (which == 1) {
    ON_EarthAnchorPoint::SetEarthLocation
              (__return_storage_ptr__,MeanSeaLevel,Feet,47.620397,-122.349179,727.0);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_EarthAnchorPoint Internal_EarthAnchorPointConstant(int which)
{
  ON_EarthAnchorPoint eap;
  switch (which)
  {
  case 1: // Seattle Space Needle
    {
      const double latitude_degrees = 47.620397; // Cal Topo Maps (downloaded June 24, 2016)
      const double longitude_degrees = -122.349179; // Cal Topo Maps (downloaded June 24, 2016)
      const double ground_elevation_feet = 207.0; // feet c. Geonames - Cal Topo Maps (downloaded June 24, 2016)
      const double observation_deck_height_feet = 520.0; // feet above the ground  http://www.spaceneedle.com/fun-facts/
      eap.SetEarthLocation(
        ON::EarthCoordinateSystem::MeanSeaLevel, 
        ON::LengthUnitSystem::Feet,
        latitude_degrees,
        longitude_degrees,
        ground_elevation_feet + observation_deck_height_feet
      );
    }
    break;
  }
  return eap;
}